

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<ImGuiWindow_*>::push_front(ImVector<ImGuiWindow_*> *this,ImGuiWindow **v)

{
  uint uVar1;
  ImGuiWindow **ppIVar2;
  long lVar3;
  int iVar4;
  
  uVar1 = this->Size;
  if (uVar1 == 0) {
    if (this->Capacity == 0) {
      ppIVar2 = (ImGuiWindow **)ImGui::MemAlloc(0x40);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(ppIVar2,this->Data,(long)this->Size << 3);
        ImGui::MemFree(this->Data);
      }
      this->Data = ppIVar2;
      this->Capacity = 8;
      lVar3 = (long)this->Size;
    }
    else {
      ppIVar2 = this->Data;
      lVar3 = 0;
    }
    ppIVar2 = ppIVar2 + lVar3;
  }
  else {
    if (uVar1 == this->Capacity) {
      iVar4 = (int)uVar1 / 2 + uVar1;
      if (iVar4 <= (int)(uVar1 + 1)) {
        iVar4 = uVar1 + 1;
      }
      ppIVar2 = (ImGuiWindow **)ImGui::MemAlloc((long)iVar4 << 3);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(ppIVar2,this->Data,(long)this->Size << 3);
        ImGui::MemFree(this->Data);
      }
      this->Data = ppIVar2;
      this->Capacity = iVar4;
      uVar1 = this->Size;
    }
    else {
      ppIVar2 = this->Data;
    }
    if (0 < (int)uVar1) {
      memmove(ppIVar2 + 1,ppIVar2,(ulong)uVar1 << 3);
      ppIVar2 = this->Data;
    }
  }
  *ppIVar2 = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }